

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::clipper_paths_to_gds
          (three_dim_model *this,Paths *target_paths,string *gds_name,int *layer_number)

{
  pointer pvVar1;
  pointer pcVar2;
  vector<int,_std::allocator<int>_> *corY;
  pointer corX;
  void *__buf;
  three_dim_model *this_00;
  pointer in_path;
  vector<co_ord,_std::allocator<co_ord>_> polygons;
  co_ord p_hold_poly;
  gdsSTR main;
  gdscpp my_polygons;
  vector<co_ord,_std::allocator<co_ord>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [32];
  _Base_ptr local_328;
  pointer piStack_320;
  undefined1 local_2d8 [248];
  gdscpp local_1e0;
  gdsSTR local_120;
  
  corY = (vector<int,_std::allocator<int>_> *)layer_number;
  gdscpp::gdscpp(&local_1e0);
  gdsSTR::gdsSTR((gdsSTR *)local_2d8);
  this_00 = (three_dim_model *)local_2d8;
  std::__cxx11::string::_M_assign((string *)this_00);
  local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pvVar1 = (target_paths->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (in_path = (target_paths->
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
               super__Vector_impl_data._M_finish, in_path != pvVar1; in_path = in_path + 1) {
    local_328 = (_Base_ptr)0x0;
    piStack_320 = (pointer)0x0;
    local_348._16_8_ = (_Base_ptr)0x0;
    local_348._24_8_ = (_Base_ptr)0x0;
    local_348._0_8_ = (pointer)0x0;
    local_348._8_8_ = 0;
    path_to_co_ord(this_00,in_path,(co_ord *)local_348);
    std::vector<co_ord,_std::allocator<co_ord>_>::push_back(&local_388,(value_type *)local_348);
    this_00 = (three_dim_model *)local_348;
    co_ord::~co_ord((co_ord *)local_348);
  }
  for (corX = local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
              super__Vector_impl_data._M_start; corX != pcVar2; corX = corX + 1) {
    corY = &corX->y;
    drawBoundary((gdsBOUNDARY *)local_348,*layer_number,&corX->x,corY);
    std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
              ((vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *)(local_2d8 + 0x50),
               (gdsBOUNDARY *)local_348);
    gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_348);
  }
  gdsSTR::gdsSTR(&local_120,(gdsSTR *)local_2d8);
  gdscpp::setSTR(&local_1e0,&local_120);
  gdsSTR::~gdsSTR(&local_120);
  std::operator+(&local_368,"data/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_368,".gds");
  gdscpp::write(&local_1e0,(int)local_348,__buf,(size_t)corY);
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&local_388);
  gdsSTR::~gdsSTR((gdsSTR *)local_2d8);
  gdscpp::~gdscpp(&local_1e0);
  return;
}

Assistant:

void MODEL3D::three_dim_model::clipper_paths_to_gds(    const ClipperLib::Paths &target_paths,
                                                        const std::string &gds_name,
                                                        const int &layer_number )
{
    gdscpp my_polygons;
    gdsSTR main;
    main.name = gds_name;
    std::vector<co_ord> polygons;
    auto paths_it_end = target_paths.end();
    for (auto path_it = target_paths.begin(); path_it != paths_it_end; path_it++)
    {
        co_ord p_hold_poly;
        path_to_co_ord(*path_it, p_hold_poly);
        polygons.push_back(p_hold_poly);
    }
    auto polygons_it_end = polygons.end();
    for (auto polygon_it = polygons.begin(); polygon_it != polygons_it_end; polygon_it++)
    {
        main.BOUNDARY.push_back(drawBoundary( layer_number , polygon_it->x, polygon_it->y));
    }
    my_polygons.setSTR(main);
    my_polygons.write("data/"+main.name+".gds");
}